

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

void uprv_currencyLeads_63(char *locale,UnicodeSet *result,UErrorCode *ec)

{
  CurrencyNameStruct *pCVar1;
  UBool UVar2;
  CurrencyNameCacheEntry *cacheEntry_00;
  uint local_54;
  uint16_t __c2_1;
  UChar32 cp_1;
  CurrencyNameStruct *info_1;
  int32_t i_1;
  uint16_t __c2;
  UChar32 cp;
  CurrencyNameStruct *info;
  int32_t i;
  CurrencyNameCacheEntry *cacheEntry;
  UErrorCode *ec_local;
  UnicodeSet *result_local;
  char *locale_local;
  
  UVar2 = U_FAILURE(*ec);
  if (UVar2 == '\0') {
    cacheEntry_00 = getCacheEntry(locale,ec);
    UVar2 = U_FAILURE(*ec);
    if (UVar2 == '\0') {
      for (info._4_4_ = 0; info._4_4_ < cacheEntry_00->totalCurrencySymbolCount;
          info._4_4_ = info._4_4_ + 1) {
        pCVar1 = cacheEntry_00->currencySymbols;
        i_1 = (int32_t)(ushort)*pCVar1[info._4_4_].currencyName;
        if (((((i_1 & 0xfffff800U) == 0xd800) && ((*pCVar1[info._4_4_].currencyName & 0x400U) == 0))
            && (pCVar1[info._4_4_].currencyNameLen != 1)) &&
           ((pCVar1[info._4_4_].currencyName[1] & 0xfc00U) == 0xdc00)) {
          i_1 = i_1 * 0x400 + (uint)(ushort)pCVar1[info._4_4_].currencyName[1] + -0x35fdc00;
        }
        icu_63::UnicodeSet::add(result,i_1);
      }
      for (info_1._4_4_ = 0; info_1._4_4_ < cacheEntry_00->totalCurrencyNameCount;
          info_1._4_4_ = info_1._4_4_ + 1) {
        pCVar1 = cacheEntry_00->currencyNames;
        local_54 = (uint)(ushort)*pCVar1[info_1._4_4_].currencyName;
        if ((((local_54 & 0xfffff800) == 0xd800) &&
            ((*pCVar1[info_1._4_4_].currencyName & 0x400U) == 0)) &&
           ((pCVar1[info_1._4_4_].currencyNameLen != 1 &&
            ((pCVar1[info_1._4_4_].currencyName[1] & 0xfc00U) == 0xdc00)))) {
          local_54 = local_54 * 0x400 + (uint)(ushort)pCVar1[info_1._4_4_].currencyName[1] +
                     0xfca02400;
        }
        icu_63::UnicodeSet::add(result,local_54);
      }
      releaseCacheEntry(cacheEntry_00);
    }
  }
  return;
}

Assistant:

void uprv_currencyLeads(const char* locale, icu::UnicodeSet& result, UErrorCode& ec) {
    U_NAMESPACE_USE
    if (U_FAILURE(ec)) {
        return;
    }
    CurrencyNameCacheEntry* cacheEntry = getCacheEntry(locale, ec);
    if (U_FAILURE(ec)) {
        return;
    }

    for (int32_t i=0; i<cacheEntry->totalCurrencySymbolCount; i++) {
        const CurrencyNameStruct& info = cacheEntry->currencySymbols[i];
        UChar32 cp;
        U16_GET(info.currencyName, 0, 0, info.currencyNameLen, cp);
        result.add(cp);
    }

    for (int32_t i=0; i<cacheEntry->totalCurrencyNameCount; i++) {
        const CurrencyNameStruct& info = cacheEntry->currencyNames[i];
        UChar32 cp;
        U16_GET(info.currencyName, 0, 0, info.currencyNameLen, cp);
        result.add(cp);
    }

    // decrease reference count
    releaseCacheEntry(cacheEntry);
}